

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bus_test.c
# Opt level: O0

void test_bus_send_buf_option(void)

{
  nng_err nVar1;
  int iVar2;
  nng_err nVar3;
  char *pcVar4;
  char *pcVar5;
  nng_err result__12;
  nng_err result__11;
  nng_err result__10;
  nng_err result__9;
  nng_err result__8;
  nng_err result__7;
  nng_err result__6;
  nng_err result__5;
  nng_err result__4;
  nng_err result__3;
  nng_err result__2;
  nng_err result__1;
  nng_err result_;
  char *opt;
  nng_socket nStack_10;
  _Bool b;
  int v;
  nng_socket s2;
  nng_socket s1;
  
  nVar1 = nng_bus0_open((nng_socket *)&v);
  pcVar4 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                         ,0x165,"%s: expected success, got %s (%d)","nng_bus0_open(&s1)",pcVar4,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_bus0_open(&stack0xfffffffffffffff0);
  pcVar4 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                         ,0x166,"%s: expected success, got %s (%d)","nng_bus0_open(&s2)",pcVar4,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nuts_marry((nng_socket)v,nStack_10);
  pcVar4 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                         ,0x167,"%s: expected success, got %s (%d)","nuts_marry(s1, s2)",pcVar4,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_set_int((nng_socket)v,"send-buffer",1);
  pcVar4 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                         ,0x169,"%s: expected success, got %s (%d)","nng_socket_set_int(s1, opt, 1)"
                         ,pcVar4,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar3 = nng_socket_set_int((nng_socket)v,"send-buffer",0);
  pcVar4 = nng_strerror(NNG_EINVAL);
  acutest_check_((uint)(nVar3 == NNG_EINVAL),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                 ,0x16a,"%s fails with %s","nng_socket_set_int(s1, opt, 0)",pcVar4,nVar1);
  pcVar4 = nng_strerror(NNG_EINVAL);
  pcVar5 = nng_strerror(nVar3);
  acutest_message_("%s: expected %s (%d), got %s (%d)","nng_socket_set_int(s1, opt, 0)",pcVar4,3,
                   pcVar5,(ulong)nVar3);
  nVar1 = nng_socket_set_int((nng_socket)v,"send-buffer",-1);
  pcVar4 = nng_strerror(NNG_EINVAL);
  acutest_check_((uint)(nVar1 == NNG_EINVAL),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                 ,0x16b,"%s fails with %s","nng_socket_set_int(s1, opt, -1)",pcVar4);
  pcVar4 = nng_strerror(NNG_EINVAL);
  pcVar5 = nng_strerror(nVar1);
  acutest_message_("%s: expected %s (%d), got %s (%d)","nng_socket_set_int(s1, opt, -1)",pcVar4,3,
                   pcVar5,(ulong)nVar1);
  nVar1 = nng_socket_set_int((nng_socket)v,"send-buffer",1000000);
  pcVar4 = nng_strerror(NNG_EINVAL);
  acutest_check_((uint)(nVar1 == NNG_EINVAL),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                 ,0x16c,"%s fails with %s","nng_socket_set_int(s1, opt, 1000000)",pcVar4);
  pcVar4 = nng_strerror(NNG_EINVAL);
  pcVar5 = nng_strerror(nVar1);
  acutest_message_("%s: expected %s (%d), got %s (%d)","nng_socket_set_int(s1, opt, 1000000)",pcVar4
                   ,3,pcVar5,(ulong)nVar1);
  nVar1 = nng_socket_set_int((nng_socket)v,"send-buffer",3);
  pcVar4 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                         ,0x16d,"%s: expected success, got %s (%d)","nng_socket_set_int(s1, opt, 3)"
                         ,pcVar4,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_get_int((nng_socket)v,"send-buffer",(int *)((long)&opt + 4));
  pcVar4 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                         ,0x16e,"%s: expected success, got %s (%d)",
                         "nng_socket_get_int(s1, opt, &v)",pcVar4,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  acutest_check_((uint)(opt._4_4_ == 3),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                 ,0x16f,"%s","v == 3");
  nVar3 = nng_socket_set_bool((nng_socket)v,"send-buffer",true);
  pcVar4 = nng_strerror(NNG_EBADTYPE);
  acutest_check_((uint)(nVar3 == NNG_EBADTYPE),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                 ,0x170,"%s fails with %s","nng_socket_set_bool(s1, opt, true)",pcVar4,nVar1);
  pcVar4 = nng_strerror(NNG_EBADTYPE);
  pcVar5 = nng_strerror(nVar3);
  acutest_message_("%s: expected %s (%d), got %s (%d)","nng_socket_set_bool(s1, opt, true)",pcVar4,
                   0x1e,pcVar5,(ulong)nVar3);
  nVar1 = nng_socket_get_bool((nng_socket)v,"send-buffer",(_Bool *)((long)&opt + 3));
  pcVar4 = nng_strerror(NNG_EBADTYPE);
  acutest_check_((uint)(nVar1 == NNG_EBADTYPE),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                 ,0x171,"%s fails with %s","nng_socket_get_bool(s1, opt, &b)",pcVar4);
  pcVar4 = nng_strerror(NNG_EBADTYPE);
  pcVar5 = nng_strerror(nVar1);
  acutest_message_("%s: expected %s (%d), got %s (%d)","nng_socket_get_bool(s1, opt, &b)",pcVar4,
                   0x1e,pcVar5,(ulong)nVar1);
  nVar1 = nng_socket_close((nng_socket)v);
  pcVar4 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                         ,0x173,"%s: expected success, got %s (%d)","nng_socket_close(s1)",pcVar4,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_close(nStack_10);
  pcVar4 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/bus0/bus_test.c"
                         ,0x174,"%s: expected success, got %s (%d)","nng_socket_close(s2)",pcVar4,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  return;
}

Assistant:

static void
test_bus_send_buf_option(void)
{
	nng_socket  s1;
	nng_socket  s2;
	int         v;
	bool        b;
	const char *opt = NNG_OPT_SENDBUF;

	NUTS_PASS(nng_bus0_open(&s1));
	NUTS_PASS(nng_bus0_open(&s2));
	NUTS_MARRY(s1, s2);

	NUTS_PASS(nng_socket_set_int(s1, opt, 1));
	NUTS_FAIL(nng_socket_set_int(s1, opt, 0), NNG_EINVAL);
	NUTS_FAIL(nng_socket_set_int(s1, opt, -1), NNG_EINVAL);
	NUTS_FAIL(nng_socket_set_int(s1, opt, 1000000), NNG_EINVAL);
	NUTS_PASS(nng_socket_set_int(s1, opt, 3));
	NUTS_PASS(nng_socket_get_int(s1, opt, &v));
	NUTS_TRUE(v == 3);
	NUTS_FAIL(nng_socket_set_bool(s1, opt, true), NNG_EBADTYPE);
	NUTS_FAIL(nng_socket_get_bool(s1, opt, &b), NNG_EBADTYPE);

	NUTS_CLOSE(s1);
	NUTS_CLOSE(s2);
}